

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O3

Light_SampleRes *
embree::PointLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  float fVar4;
  float fVar5;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar6 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [12];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar18 [16];
  float fVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  vfloat4 a;
  float fVar32;
  float fVar33;
  vfloat4 a_1;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  vfloat4 a0;
  undefined1 auVar37 [16];
  undefined1 auVar28 [16];
  undefined1 auVar35 [16];
  
  fVar10 = (float)super[4].type - (dg->P).field_0.m128[0];
  fVar12 = (float)super[5].type - (dg->P).field_0.m128[1];
  fVar13 = (float)super[6].type - (dg->P).field_0.m128[2];
  fVar14 = (float)super[7].type - (dg->P).field_0.m128[3];
  fVar7 = fVar12 * fVar12;
  fVar8 = fVar13 * fVar13;
  fVar9 = fVar14 * fVar14;
  fVar25 = fVar7 + fVar10 * fVar10 + fVar8;
  auVar28._0_8_ = CONCAT44(fVar7 + fVar7 + fVar9,fVar25);
  auVar28._8_4_ = fVar7 + fVar8 + fVar8;
  auVar28._12_4_ = fVar7 + fVar9 + fVar9;
  auVar6._8_4_ = auVar28._8_4_;
  auVar6._0_8_ = auVar28._0_8_;
  auVar6._12_4_ = auVar28._12_4_;
  auVar6 = rsqrtss(auVar6,auVar28);
  fVar7 = auVar6._0_4_;
  fVar4 = fVar7 * fVar7 * fVar25 * -0.5 * fVar7 + fVar7 * 1.5;
  fVar10 = fVar4 * fVar10;
  fVar12 = fVar4 * fVar12;
  fVar13 = fVar4 * fVar13;
  fVar14 = fVar4 * fVar14;
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar10;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar12;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar13;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar14;
  __return_storage_ptr__->dist = fVar25 * fVar4;
  __return_storage_ptr__->pdf = INFINITY;
  fVar11 = fVar4 * fVar4;
  fVar7 = (float)super[9].type;
  fVar8 = (float)super[10].type;
  fVar9 = (float)super[0xb].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar11 * (float)super[8].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar11 * fVar7;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar11 * fVar8;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar11 * fVar9;
  if ((0.0 < (float)super[0xc].type) && (fVar7 = (float)super[0xc].type * fVar4, 0.005 < fVar7)) {
    if (1.0 <= fVar7) {
      fVar7 = (s->field_0).field_0.x;
      fVar8 = (s->field_0).field_0.y;
      if (fVar8 < 0.0) {
        fVar9 = sqrtf(fVar8);
      }
      else {
        fVar9 = SQRT(fVar8);
      }
      fVar7 = fVar7 * 6.2831855;
      fVar8 = 1.0 - fVar8;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar4 = sinf(fVar7);
      fVar10 = cosf(fVar7);
      fVar10 = fVar10 * fVar8;
      fVar4 = fVar4 * fVar8;
      fVar7 = (dg->Ns).field_0.m128[0];
      fVar8 = (dg->Ns).field_0.m128[2];
      fVar11 = -(dg->Ns).field_0.m128[1];
      fVar12 = -fVar8;
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      if (fVar11 * fVar11 + fVar8 * fVar8 + 0.0 <= fVar7 * fVar7 + fVar12 * fVar12 + 0.0) {
        auVar17 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar8 = (float)((uint)fVar8 & auVar17._4_4_);
      fVar12 = (float)(~auVar17._0_4_ & (uint)fVar12);
      fVar15 = (float)(~auVar17._8_4_ & (uint)fVar7 | (uint)fVar11 & auVar17._8_4_);
      fVar7 = fVar8 * fVar8;
      fVar11 = fVar15 * fVar15;
      fVar13 = fVar7 + fVar12 * fVar12 + fVar11;
      fVar14 = fVar7 + fVar7 + 0.0;
      fVar11 = fVar7 + fVar11 + fVar11;
      fVar7 = fVar7 + 0.0 + 0.0;
      auVar36._4_4_ = fVar14;
      auVar36._0_4_ = fVar13;
      auVar36._8_4_ = fVar11;
      auVar36._12_4_ = fVar7;
      auVar2._4_4_ = fVar14;
      auVar2._0_4_ = fVar13;
      auVar2._8_4_ = fVar11;
      auVar2._12_4_ = fVar7;
      auVar6 = rsqrtss(auVar36,auVar2);
      fVar7 = auVar6._0_4_;
      fVar5 = fVar7 * 1.5 - fVar7 * fVar7 * fVar13 * 0.5 * fVar7;
      fVar12 = fVar5 * fVar12;
      fVar8 = fVar5 * fVar8;
      fVar15 = fVar5 * fVar15;
      fVar5 = fVar5 * 0.0;
      fVar7 = (dg->Ns).field_0.m128[0];
      fVar11 = (dg->Ns).field_0.m128[1];
      fVar13 = (dg->Ns).field_0.m128[2];
      fVar14 = (dg->Ns).field_0.m128[3];
      fVar32 = fVar8 * fVar7 - fVar11 * fVar12;
      fVar16 = fVar15 * fVar11 - fVar13 * fVar8;
      fVar30 = fVar12 * fVar13 - fVar7 * fVar15;
      fVar31 = fVar5 * fVar14 - fVar14 * fVar5;
      fVar25 = fVar16 * fVar16;
      fVar19 = fVar30 * fVar30;
      fVar20 = fVar31 * fVar31;
      fVar21 = fVar19 + fVar25 + fVar32 * fVar32;
      auVar37._0_8_ = CONCAT44(fVar20 + fVar25 + fVar25,fVar21);
      auVar37._8_4_ = fVar19 + fVar25 + fVar19;
      auVar37._12_4_ = fVar20 + fVar25 + fVar20;
      auVar29._8_4_ = auVar37._8_4_;
      auVar29._0_8_ = auVar37._0_8_;
      auVar29._12_4_ = auVar37._12_4_;
      auVar6 = rsqrtss(auVar29,auVar37);
      fVar25 = auVar6._0_4_;
      fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * fVar21 * 0.5 * fVar25;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           fVar10 * fVar12 + fVar9 * fVar7 + fVar4 * fVar25 * fVar16;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           fVar10 * fVar8 + fVar9 * fVar11 + fVar4 * fVar25 * fVar30;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           fVar10 * fVar15 + fVar9 * fVar13 + fVar4 * fVar25 * fVar32;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           fVar10 * fVar5 + fVar9 * fVar14 + fVar4 * fVar25 * fVar31;
      __return_storage_ptr__->pdf = fVar9 / 3.1415927;
      fVar7 = (float)super[0xc].type;
      fVar8 = fVar7 * fVar7;
      auVar6 = rcpss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar10 = (2.0 - fVar8 * auVar6._0_4_) * auVar6._0_4_;
      fVar8 = (float)super[9].type;
      fVar9 = (float)super[10].type;
      fVar4 = (float)super[0xb].type;
      (__return_storage_ptr__->weight).field_0.m128[0] = fVar10 * (float)super[8].type;
      (__return_storage_ptr__->weight).field_0.m128[1] = fVar10 * fVar8;
      (__return_storage_ptr__->weight).field_0.m128[2] = fVar10 * fVar9;
      (__return_storage_ptr__->weight).field_0.m128[3] = fVar10 * fVar4;
    }
    else {
      fVar7 = 1.0 - fVar7 * fVar7;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar15 = (s->field_0).field_0.x * 6.2831855;
      fVar9 = 1.0 - (s->field_0).field_0.y * (1.0 - fVar7);
      fVar11 = 1.0 - fVar9 * fVar9;
      fVar8 = fVar11;
      if (fVar11 <= 0.0) {
        fVar8 = 0.0;
      }
      fVar5 = sinf(fVar15);
      fVar15 = cosf(fVar15);
      fVar15 = fVar15 * SQRT(fVar8);
      fVar5 = fVar5 * SQRT(fVar8);
      fVar32 = -fVar12;
      fVar8 = -fVar13;
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      if (fVar32 * fVar32 + fVar13 * fVar13 + 0.0 <= fVar10 * fVar10 + fVar8 * fVar8 + 0.0) {
        auVar26 = SUB1612((undefined1  [16])0x0,0);
      }
      auVar3._4_4_ = (uint)fVar32 & auVar26._8_4_;
      auVar3._0_4_ = (uint)fVar13 & auVar26._4_4_;
      auVar3._8_4_ = 0;
      auVar27._0_4_ = ~auVar26._0_4_ & (uint)fVar8;
      auVar27._4_4_ = 0;
      auVar27._8_4_ = ~auVar26._8_4_ & (uint)fVar10;
      auVar27 = auVar27 | auVar3 << 0x20;
      fVar16 = auVar27._0_4_;
      fVar19 = auVar27._4_4_;
      fVar20 = auVar27._8_4_;
      fVar8 = fVar19 * fVar19;
      fVar32 = fVar20 * fVar20;
      fVar30 = fVar8 + fVar16 * fVar16 + fVar32;
      fVar31 = fVar8 + fVar8 + 0.0;
      fVar32 = fVar8 + fVar32 + fVar32;
      fVar8 = fVar8 + 0.0 + 0.0;
      auVar34._4_4_ = fVar31;
      auVar34._0_4_ = fVar30;
      auVar34._8_4_ = fVar32;
      auVar34._12_4_ = fVar8;
      auVar1._4_4_ = fVar31;
      auVar1._0_4_ = fVar30;
      auVar1._8_4_ = fVar32;
      auVar1._12_4_ = fVar8;
      auVar6 = rsqrtss(auVar34,auVar1);
      fVar8 = auVar6._0_4_;
      fVar32 = fVar8 * 1.5 - fVar8 * fVar8 * fVar30 * 0.5 * fVar8;
      fVar16 = fVar32 * fVar16;
      fVar19 = fVar32 * fVar19;
      fVar20 = fVar32 * fVar20;
      fVar32 = fVar32 * 0.0;
      fVar30 = fVar19 * fVar10 - fVar12 * fVar16;
      fVar31 = fVar20 * fVar12 - fVar13 * fVar19;
      fVar21 = fVar16 * fVar13 - fVar10 * fVar20;
      fVar23 = fVar32 * fVar14 - fVar14 * fVar32;
      fVar8 = fVar31 * fVar31;
      fVar22 = fVar21 * fVar21;
      fVar24 = fVar23 * fVar23;
      fVar33 = fVar22 + fVar8 + fVar30 * fVar30;
      auVar35._0_8_ = CONCAT44(fVar24 + fVar8 + fVar8,fVar33);
      auVar35._8_4_ = fVar22 + fVar8 + fVar22;
      auVar35._12_4_ = fVar24 + fVar8 + fVar24;
      auVar18._8_4_ = auVar35._8_4_;
      auVar18._0_8_ = auVar35._0_8_;
      auVar18._12_4_ = auVar35._12_4_;
      auVar6 = rsqrtss(auVar18,auVar35);
      fVar8 = auVar6._0_4_;
      fVar8 = fVar8 * 1.5 - fVar8 * fVar8 * fVar33 * 0.5 * fVar8;
      (__return_storage_ptr__->dir).field_0.m128[0] =
           fVar15 * fVar16 + fVar9 * fVar10 + fVar5 * fVar8 * fVar31;
      (__return_storage_ptr__->dir).field_0.m128[1] =
           fVar15 * fVar19 + fVar9 * fVar12 + fVar5 * fVar8 * fVar21;
      (__return_storage_ptr__->dir).field_0.m128[2] =
           fVar15 * fVar20 + fVar9 * fVar13 + fVar5 * fVar8 * fVar30;
      (__return_storage_ptr__->dir).field_0.m128[3] =
           fVar15 * fVar32 + fVar9 * fVar14 + fVar5 * fVar8 * fVar23;
      fVar7 = (1.0 - fVar7) * 6.2831855;
      auVar6 = rcpss(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
      __return_storage_ptr__->pdf = (2.0 - fVar7 * auVar6._0_4_) * auVar6._0_4_;
      fVar7 = (float)super[0xc].type * (float)super[0xc].type - fVar11 * fVar25;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar7 = fVar9 * fVar25 * fVar4 - fVar7;
    }
    __return_storage_ptr__->dist = fVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes PointLight_sample(const Light* super,
                                                               const DifferentialGeometry& dg,
                                                               const Vec2f& s)
{
  const PointLight* self = (PointLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  const Vec3fa dir = self->position - dg.P;
  const float dist2 = dot(dir, dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = dir * invdist;
  res.dist = dist2 * invdist;

  res.pdf = inf; // per default we always take this res

  // convert from power to radiance by attenuating by distance^2
  res.weight = self->power * sqr(invdist);
  const float sinTheta = self->radius * invdist;

  if ((self->radius > 0.f) & (sinTheta > 0.005f)) {
    // res surface of sphere as seen by hit point -> cone of directions
    // for very small cones treat as point light, because float precision is not good enough
    if (sinTheta < 1.f) {
      const float cosTheta = sqrt(1.f - sinTheta * sinTheta);
      const Vec3fa localDir = uniformSampleCone(cosTheta, s);
      res.dir = frame(res.dir) * localDir;
      res.pdf = uniformSampleConePDF(cosTheta);
      const float c = localDir.z;
      res.dist = c*res.dist - sqrt(sqr(self->radius) - (1.f - c*c) * dist2);
      // TODO scale radiance by actual distance
    } else { // inside sphere
      const Vec3fa localDir = cosineSampleHemisphere(s);
      res.dir = frame(dg.Ns) * localDir;
      res.pdf = cosineSampleHemispherePDF(localDir);
      // TODO:
      res.weight = self->power * rcp(sqr(self->radius));
      res.dist = self->radius;
    }
  }

  return res;
}